

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void recharge(obj *obj,int curse_bless)

{
  ushort uVar1;
  obj *poVar2;
  char cVar3;
  char cVar4;
  schar sVar5;
  schar sVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int x;
  monst *pmVar10;
  long lVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  char *pcVar15;
  char *pcVar16;
  obj *poVar17;
  bool bVar18;
  bool bVar19;
  char cStack_40;
  long local_38;
  
  if (-1 < curse_bless) {
    obj->field_0x4a = obj->field_0x4a | 0x10;
  }
  cVar4 = obj->oclass;
  if (cVar4 == '\x04') {
    if ((objects[obj->otyp].field_0x10 & 0x20) != 0) {
      if (curse_bless < 1) {
        if (curse_bless < 0) {
          iVar8 = rnd(2);
          iVar8 = -iVar8;
        }
        else {
          iVar8 = 1;
        }
      }
      else {
        iVar8 = rnd(3);
      }
      bVar19 = uleft == obj;
      bVar18 = uright == obj;
      cVar4 = obj->spe;
      uVar9 = mt_random();
      poVar17 = uleft;
      if (((int)(uVar9 % 6 + 3) < (int)cVar4) || ((curse_bless < 0 && (obj->spe < -4)))) {
        pcVar16 = xname(obj);
        pcVar15 = otense(obj,"pulsate");
        pcVar12 = otense(obj,"explode");
        pline("Your %s %s momentarily, then %s!",pcVar16,pcVar15,pcVar12);
        if (bVar18 || bVar19) {
          Ring_gone(obj);
        }
        bVar13 = obj->spe >> 7;
        bVar13 = (obj->spe ^ bVar13) - bVar13;
        iVar8 = rnd((uint)bVar13 + (uint)bVar13 * 2);
        useup(obj);
        losehp(iVar8,"exploding ring",0);
        return;
      }
      pcVar16 = xname(obj);
      pcVar15 = "";
      if (iVar8 < 0) {
        pcVar15 = "counter";
      }
      pline("Your %s spins %sclockwise for a moment.",pcVar16,pcVar15);
      if (!bVar18 && !bVar19) {
        obj->spe = obj->spe + (char)iVar8;
        return;
      }
      Ring_off(obj);
      obj->spe = obj->spe + (char)iVar8;
      setworn(obj,(ulong)(poVar17 != obj) * 0x20000 + 0x20000);
      Ring_on(obj,'\0');
      return;
    }
    goto switchD_0021fc46_caseD_e9;
  }
  if (cVar4 != '\x06') {
    if (cVar4 == '\v') {
      if (obj->spe == -1) {
        obj->spe = '\0';
      }
      uVar9 = *(uint *)&obj->field_0x4a;
      uVar14 = uVar9 >> 0x10 & 7;
      uVar7 = uVar9;
      if (uVar14 != 0) {
        if ((obj->otyp == 0x1c2) || (uVar7 = mt_random(), uVar7 % 0x157 < uVar14 * uVar14 * uVar14))
        goto LAB_0021fcf6;
        uVar7 = *(uint *)&obj->field_0x4a;
      }
      *(uint *)&obj->field_0x4a = uVar7 & 0xfff8ffff | uVar9 + 0x10000 & 0x70000;
      if (curse_bless < 0) goto LAB_002200d5;
      if ((long)obj->otyp == 0x1c2) {
        iVar8 = 3;
        x = iVar8;
      }
      else {
        iVar8 = 8;
        if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0xc) == 4) {
          iVar8 = 0xf;
        }
        uVar9 = mt_random();
        x = uVar9 % 5 + iVar8 + -4;
      }
      if (curse_bless < 1) {
        x = rnd(x);
      }
      cVar4 = obj->spe + '\x01';
      if (obj->spe < x) {
        cVar4 = (char)x;
      }
      obj->spe = cVar4;
      if ((obj->otyp == 0x1c2) && ('\x03' < cVar4)) {
LAB_0021fcf6:
        wand_explode(obj);
        return;
      }
      if (cVar4 < iVar8) goto LAB_0022011f;
      goto LAB_002200b8;
    }
    goto switchD_0021fc46_caseD_e9;
  }
  uVar9 = *(uint *)&obj->field_0x4a;
  uVar7 = uVar9 >> 0x10 & 7;
  if (uVar7 != 7) {
    uVar9 = uVar9 & 0xfff8ffff | uVar9 + 0x10000 & 0x70000;
    *(uint *)&obj->field_0x4a = uVar9;
  }
  uVar1 = obj->otyp;
  switch(uVar1) {
  case 0xe7:
  case 0xe8:
    if (curse_bless < 0) {
      stripspe(obj);
      if ((obj->field_0x4c & 8) == 0) {
        return;
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00220019;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00220010;
      }
      else {
LAB_00220010:
        if (ublindf == (obj *)0x0) goto LAB_002201ef;
LAB_00220019:
        if (ublindf->oartifact != '\x1d') goto LAB_002201ef;
      }
      pcVar16 = Tobjnam(obj,"go");
      pline("%s out!",pcVar16);
LAB_002201ef:
      end_burn(obj,'\x01');
      return;
    }
    obj->spe = '\x01';
    if (curse_bless < 1) {
      iVar8 = 0x5dc;
      if (obj->age < 0x2ef) {
        iVar8 = obj->age + 0x2ee;
      }
      obj->age = iVar8;
      goto LAB_0022011f;
    }
    obj->age = 0x5dc;
    break;
  case 0xea:
  case 0xf3:
  case 0xf7:
    if (curse_bless < 0) goto LAB_002200d5;
    if (uVar1 == 0xf7 && uVar7 != 0) {
      *(uint *)&obj->field_0x4a = uVar9 & 0xfff8ffff | 0x10000;
      if (obj->spe < '\x03') {
        pcVar16 = "Your marker seems permanently dried out.";
        goto LAB_0021fc0f;
      }
LAB_0022017e:
      pcVar16 = "Nothing happens.";
      goto LAB_0021fc0f;
    }
    uVar9 = mt_random();
    if (curse_bless < 1) {
      iVar8 = uVar9 % 0xb + (int)obj->spe + 10;
      sVar5 = '\x7f';
      if (iVar8 < 0x7f) {
        sVar5 = (schar)iVar8;
      }
      sVar6 = '2';
      if (0x32 < iVar8) {
        sVar6 = sVar5;
      }
      obj->spe = sVar6;
      pcVar16 = "dark white";
      goto LAB_002200bf;
    }
    uVar9 = (int)obj->spe + (uVar9 & 0xf) + 0xf;
    sVar5 = '2';
    if (((0x32 < (int)uVar9) && (sVar5 = 'K', 0x4b < uVar9)) && (sVar5 = '\x7f', uVar9 < 0x7f)) {
      sVar5 = (schar)uVar9;
    }
    obj->spe = sVar5;
    break;
  case 0xec:
    if (curse_bless < 0) goto LAB_002200d5;
    if (curse_bless < 1) {
      if (obj->spe < '\x05') {
        obj->spe = obj->spe + '\x01';
        goto LAB_0022011f;
      }
      goto LAB_0022017e;
    }
    obj->spe = '\x06';
    break;
  case 0xf5:
switchD_0021fc46_caseD_f5:
    if (curse_bless < 0) {
LAB_002200d5:
      stripspe(obj);
      return;
    }
    if (curse_bless < 1) {
      iVar8 = rnd(5);
      cVar3 = (char)iVar8 + obj->spe;
      bVar19 = SBORROW1(cVar3,'2');
      cVar4 = cVar3 + -0x32;
      cStack_40 = '2';
LAB_002200fd:
      if (bVar19 != cVar4 < '\0') {
        cStack_40 = cVar3;
      }
      obj->spe = cStack_40;
LAB_0022011f:
      p_glow1(obj);
      return;
    }
    cVar4 = obj->spe;
    uVar9 = mt_random();
    cVar4 = (char)(uVar9 % ((uint)(cVar4 < '\v') * 5 + 5)) + obj->spe;
    cVar3 = cVar4 + '\x06';
    bVar19 = SBORROW1(cVar3,'2');
    cVar4 = cVar4 + -0x2c;
    cStack_40 = '2';
LAB_002200b1:
    if (bVar19 != cVar4 < '\0') {
      cStack_40 = cVar3;
    }
    obj->spe = cStack_40;
    break;
  default:
    uVar9 = uVar1 - 0xfd;
    if (uVar9 < 0x10) {
      if ((0x44dU >> (uVar9 & 0x1f) & 1) == 0) {
        if (uVar9 == 4) goto switchD_0021fc46_caseD_f5;
        if (uVar9 == 0xf) {
          if (curse_bless < 0) {
            stripspe(obj);
            cVar4 = obj->spe;
          }
          else {
            if (curse_bless < 1) {
              cVar4 = obj->spe + '\x01';
            }
            else {
              iVar8 = rnd(3);
              cVar4 = (char)iVar8 + obj->spe;
            }
            obj->spe = cVar4;
          }
          if (cVar4 < '\x06') {
            return;
          }
          obj->spe = '\x05';
          return;
        }
        goto LAB_0021fd67;
      }
      if (curse_bless < 0) goto LAB_002200d5;
      if (curse_bless < 1) {
        iVar8 = rnd(4);
        cVar3 = (char)iVar8 + obj->spe;
        bVar19 = SBORROW1(cVar3,'\x14');
        cVar4 = cVar3 + -0x14;
        cStack_40 = '\x14';
        goto LAB_002200fd;
      }
      iVar8 = dice(2,(uint)uVar1);
      cVar3 = (char)iVar8 + obj->spe;
      bVar19 = SBORROW1(cVar3,'\x14');
      cVar4 = cVar3 + -0x14;
      cStack_40 = '\x14';
      goto LAB_002200b1;
    }
LAB_0021fd67:
    if (uVar1 == 0xe1) {
      if (curse_bless < 0) goto LAB_002200d5;
      iVar8 = 1;
      discover_object(0xe1,'\x01','\x01');
      local_38 = 0;
      poVar17 = obj->cobj;
      while (poVar17 != (obj *)0x0) {
        poVar2 = poVar17->nobj;
        obj_extract_self(poVar17);
        if (((u.ushops[0] != '\0') &&
            (pmVar10 = shop_keeper(level,u.ushops[0]), pmVar10 != (monst *)0x0)) &&
           ((poVar17->field_0x4a & 4) != 0)) {
          lVar11 = stolen_value(poVar17,u.ux,u.uy,(byte)(*(uint *)&pmVar10->field_0x60 >> 0x16) & 1,
                                '\x01');
          local_38 = local_38 + lVar11;
        }
        obfree(poVar17,(obj *)0x0);
        iVar8 = iVar8 + -1;
        poVar17 = poVar2;
      }
      if (iVar8 != 1) {
        pcVar16 = yname(obj);
        You_hear("loud crunching sounds from inside %s.",pcVar16);
        if (local_38 != 0) {
          pcVar16 = currency(local_38);
          pcVar15 = "s";
          if (iVar8 == 0) {
            pcVar15 = "";
          }
          pline("You owe %ld %s for lost item%s.",local_38,pcVar16,pcVar15);
        }
      }
      goto switchD_0021fc46_caseD_f5;
    }
  case 0xe9:
  case 0xeb:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf4:
  case 0xf6:
switchD_0021fc46_caseD_e9:
    pcVar16 = "You have a feeling of loss.";
LAB_0021fc0f:
    pline(pcVar16);
    return;
  }
LAB_002200b8:
  pcVar16 = "dark blue";
LAB_002200bf:
  p_glow2(obj,pcVar16 + 5);
  return;
}

Assistant:

void recharge(struct obj *obj, int curse_bless)
{
	int n;
	boolean is_cursed, is_blessed;

	is_cursed = curse_bless < 0;
	is_blessed = curse_bless > 0;

	/* Scrolls of charging now ID charge count, as well as doing
	 * the charging, unless cursed. */
	if (!is_cursed) obj->known = 1;

	if (obj->oclass == WAND_CLASS) {
	    /* undo any prior cancellation, even when is_cursed */
	    if (obj->spe == -1) obj->spe = 0;

	    /*
	     * Recharging might cause wands to explode.
	     *	v = number of previous recharges
	     *	      v = percentage chance to explode on this attempt
	     *		      v = cumulative odds for exploding
	     *	0 :   0       0
	     *	1 :   0.29    0.29
	     *	2 :   2.33    2.62
	     *	3 :   7.87   10.28
	     *	4 :  18.66   27.02
	     *	5 :  36.44   53.62
	     *	6 :  62.97   82.83
	     *	7 : 100     100
	     */
	    n = (int)obj->recharged;
	    if (n > 0 && (obj->otyp == WAN_WISHING ||
		    (n * n * n > rn2(7*7*7)))) {	/* recharge_limit */
		wand_explode(obj);
		return;
	    }
	    /* didn't explode, so increment the recharge count */
	    obj->recharged = (unsigned)(n + 1);

	    /* now handle the actual recharging */
	    if (is_cursed) {
		stripspe(obj);
	    } else {
		int lim = (obj->otyp == WAN_WISHING) ? 3 :
			(objects[obj->otyp].oc_dir != NODIR) ? 8 : 15;

		n = (lim == 3) ? 3 : rn1(5, lim + 1 - 5);
		if (!is_blessed) n = rnd(n);

		if (obj->spe < n) obj->spe = n;
		else obj->spe++;
		if (obj->otyp == WAN_WISHING && obj->spe > 3) {
		    wand_explode(obj);
		    return;
		}
		if (obj->spe >= lim) p_glow2(obj, "blue");
		else p_glow1(obj);
	    }

	} else if (obj->oclass == RING_CLASS &&
					objects[obj->otyp].oc_charged) {
	    /* charging does not affect ring's curse/bless status */
	    int s = is_blessed ? rnd(3) : is_cursed ? -rnd(2) : 1;
	    boolean is_on = (obj == uleft || obj == uright);

	    /* destruction depends on current state, not adjustment */
	    if (obj->spe > rn2(6) + 3 || (is_cursed && obj->spe <= -5)) {
		pline("Your %s %s momentarily, then %s!",
		     xname(obj), otense(obj,"pulsate"), otense(obj,"explode"));
		if (is_on) Ring_gone(obj);
		s = rnd(3 * abs(obj->spe));	/* amount of damage */
		useup(obj);
		losehp(s, "exploding ring", KILLED_BY_AN);
	    } else {
		long mask = is_on ? (obj == uleft ? LEFT_RING :
				     RIGHT_RING) : 0L;
		pline("Your %s spins %sclockwise for a moment.",
		     xname(obj), s < 0 ? "counter" : "");
		/* cause attributes and/or properties to be updated */
		if (is_on) Ring_off(obj);
		obj->spe += s;	/* update the ring while it's off */
		if (is_on) setworn(obj, mask), Ring_on(obj, FALSE);
		/* oartifact: if a touch-sensitive artifact ring is
		   ever created the above will need to be revised  */
	    }

	} else if (obj->oclass == TOOL_CLASS) {
	    int rechrg = (int)obj->recharged;

	    /* tools don't have a limit, but the counter used does */
	    if (rechrg < 7)	/* recharge_limit */
		obj->recharged++;

	    switch(obj->otyp) {
	    case BELL_OF_OPENING:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) obj->spe += rnd(3);
		else obj->spe += 1;
		if (obj->spe > 5) obj->spe = 5;
		break;
	    case MAGIC_MARKER:
	    case TINNING_KIT:
	    case EXPENSIVE_CAMERA:
		if (is_cursed) stripspe(obj);
		else if (rechrg && obj->otyp == MAGIC_MARKER) {	/* previously recharged */
		    obj->recharged = 1;	/* override increment done above */
		    if (obj->spe < 3)
			pline("Your marker seems permanently dried out.");
		    else
			pline("Nothing happens.");
		} else if (is_blessed) {
		    n = rn1(16,15);		/* 15..30 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else if (obj->spe + n <= 75)
			obj->spe = 75;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "blue");
		} else {
		    n = rn1(11,10);		/* 10..20 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "white");
		}
		break;
	    case OIL_LAMP:
	    case BRASS_LANTERN:
		if (is_cursed) {
		    stripspe(obj);
		    if (obj->lamplit) {
			if (!Blind)
			    pline("%s out!", Tobjnam(obj, "go"));
			end_burn(obj, TRUE);
		    }
		} else if (is_blessed) {
		    obj->spe = 1;
		    obj->age = 1500;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe = 1;
		    obj->age += 750;
		    if (obj->age > 1500) obj->age = 1500;
		    p_glow1(obj);
		}
		break;
	    case CRYSTAL_BALL:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    obj->spe = 6;
		    p_glow2(obj, "blue");
		} else {
		    if (obj->spe < 5) {
			obj->spe++;
			p_glow1(obj);
		    } else pline("Nothing happens.");
		}
		break;
	    case BAG_OF_TRICKS:
		/* if there are any objects inside the bag, devour them */
		if (!is_cursed) {
		    struct obj *curr, *otmp;
		    struct monst *shkp;
		    int lcnt = 0;
		    long loss = 0L;

		    makeknown(BAG_OF_TRICKS);
		    for (curr = obj->cobj; curr; curr = otmp) {
			otmp = curr->nobj;
			obj_extract_self(curr);
			lcnt++;
			if (*u.ushops && (shkp = shop_keeper(level, *u.ushops)) != 0) {
			    if (curr->unpaid)
				loss += stolen_value(curr, u.ux, u.uy,
						     (boolean)shkp->mpeaceful, TRUE);
			}
			/* obfree() will free all contained objects */
			obfree(curr, NULL);
		    }

		    if (lcnt)
			You_hear("loud crunching sounds from inside %s.", yname(obj));
		    if (lcnt && loss)
			pline("You owe %ld %s for lost item%s.",
			      loss, currency(loss), lcnt > 1 ? "s" : "");
		}
		/* fall through */
	    case HORN_OF_PLENTY:
	    case CAN_OF_GREASE:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    if (obj->spe <= 10)
			obj->spe += rn1(10, 6);
		    else obj->spe += rn1(5, 6);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(5);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow1(obj);
		}
		break;
	    case MAGIC_FLUTE:
	    case MAGIC_HARP:
	    case FROST_HORN:
	    case FIRE_HORN:
	    case DRUM_OF_EARTHQUAKE:
		if (is_cursed) {
		    stripspe(obj);
		} else if (is_blessed) {
		    obj->spe += dice(2,4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow1(obj);
		}
		break;
	    default:
		goto not_chargable;
		/*NOTREACHED*/
		break;
	    } /* switch */

	} else {
 not_chargable:
	    pline("You have a feeling of loss.");
	}
}